

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

bool __thiscall S1Interval::ApproxEquals(S1Interval *this,S1Interval *y,double max_error)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = (this->bounds_).c_[0];
  dVar5 = (this->bounds_).c_[1];
  if ((((dVar4 != 3.141592653589793) || (NAN(dVar4))) || (dVar5 != -3.141592653589793)) ||
     (NAN(dVar5))) {
    dVar1 = (y->bounds_).c_[0];
    dVar6 = (y->bounds_).c_[1];
    if (((dVar1 == 3.141592653589793) && (!NAN(dVar1))) &&
       ((dVar6 == -3.141592653589793 && (!NAN(dVar6))))) {
      dVar5 = dVar5 - dVar4;
      if (dVar5 < 0.0) {
        uVar3 = -(ulong)(0.0 < dVar5 + 6.283185307179586);
        dVar5 = (double)((ulong)(dVar5 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
      }
      bVar2 = max_error + max_error < dVar5;
      goto LAB_0019cd33;
    }
    if (((dVar4 == -3.141592653589793) && (!NAN(dVar4))) &&
       ((dVar5 == 3.141592653589793 && (!NAN(dVar5))))) {
      dVar6 = dVar6 - dVar1;
      if (dVar6 < 0.0) {
        uVar3 = -(ulong)(0.0 < dVar6 + 6.283185307179586);
        dVar6 = (double)((ulong)(dVar6 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
      }
      bVar2 = dVar6 < (3.141592653589793 - max_error) + (3.141592653589793 - max_error);
      goto LAB_0019cd33;
    }
    if ((((dVar1 == -3.141592653589793) && (!NAN(dVar1))) && (dVar6 == 3.141592653589793)) &&
       (!NAN(dVar6))) {
      dVar5 = dVar5 - dVar4;
      if (dVar5 < 0.0) {
        uVar3 = -(ulong)(0.0 < dVar5 + 6.283185307179586);
        dVar5 = (double)((ulong)(dVar5 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
      }
      bVar2 = dVar5 < (3.141592653589793 - max_error) + (3.141592653589793 - max_error);
      goto LAB_0019cd33;
    }
    dVar4 = remainder(dVar1 - dVar4,6.283185307179586);
    if ((max_error < ABS(dVar4)) ||
       (dVar4 = remainder((y->bounds_).c_[1] - (this->bounds_).c_[1],6.283185307179586),
       max_error < ABS(dVar4))) {
      return false;
    }
    dVar4 = (this->bounds_).c_[1] - (this->bounds_).c_[0];
    if (dVar4 < 0.0) {
      uVar3 = -(ulong)(0.0 < dVar4 + 6.283185307179586);
      dVar4 = (double)((ulong)(dVar4 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
    }
    dVar5 = (y->bounds_).c_[1] - (y->bounds_).c_[0];
    if (dVar5 < 0.0) {
      uVar3 = -(ulong)(0.0 < dVar5 + 6.283185307179586);
      dVar5 = (double)((ulong)(dVar5 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
    }
    dVar4 = ABS(dVar4 - dVar5);
  }
  else {
    dVar4 = (y->bounds_).c_[1] - (y->bounds_).c_[0];
    if (dVar4 < 0.0) {
      uVar3 = -(ulong)(0.0 < dVar4 + 6.283185307179586);
      dVar4 = (double)((ulong)(dVar4 + 6.283185307179586) & uVar3 | ~uVar3 & 0xbff0000000000000);
    }
  }
  bVar2 = max_error + max_error < dVar4;
LAB_0019cd33:
  return !bVar2;
}

Assistant:

bool S1Interval::ApproxEquals(const S1Interval& y, double max_error) const {
  // Full and empty intervals require special cases because the "endpoints"
  // are considered to be positioned arbitrarily.
  if (is_empty()) return y.GetLength() <= 2 * max_error;
  if (y.is_empty()) return GetLength() <= 2 * max_error;
  if (is_full()) return y.GetLength() >= 2 * (M_PI - max_error);
  if (y.is_full()) return GetLength() >= 2 * (M_PI - max_error);

  // The purpose of the last test below is to verify that moving the endpoints
  // does not invert the interval, e.g. [-1e20, 1e20] vs. [1e20, -1e20].
  return (fabs(remainder(y.lo() - lo(), 2 * M_PI)) <= max_error &&
          fabs(remainder(y.hi() - hi(), 2 * M_PI)) <= max_error &&
          fabs(GetLength() - y.GetLength()) <= 2 * max_error);
}